

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<TestExprBuilder<0,BasicTestExpr<0>>>>,std::tuple<TestExprBuilder<0,BasicTestExpr<0>>>>
               (tuple<testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *matchers,
               tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_> *values,ostream *os)

{
  bool bVar1;
  StringMatchResultListener *this;
  ostream *in_RDX;
  tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_> *in_RSI;
  tuple<testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *in_RDI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *in_stack_fffffffffffffde8;
  StringMatchResultListener *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  string local_200 [4];
  TestExprBuilder<0,_BasicTestExpr<0>_> in_stack_fffffffffffffe04;
  StringMatchResultListener *in_stack_fffffffffffffe10;
  
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<TestExprBuilder<0,BasicTestExpr<0>>>>,std::tuple<TestExprBuilder<0,BasicTestExpr<0>>>>
            (in_RDI,in_RSI,in_RDX);
  std::get<0ul,testing::Matcher<TestExprBuilder<0,BasicTestExpr<0>>>>
            ((tuple<testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *)0x2c25a9);
  Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>::Matcher
            ((Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  std::get<0ul,TestExprBuilder<0,BasicTestExpr<0>>>
            ((tuple<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)0x2c25c6);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe10);
  bVar1 = MatcherBase<TestExprBuilder<0,_BasicTestExpr<0>_>_>::MatchAndExplain
                    ((MatcherBase<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)
                     CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffe04,&in_stack_fffffffffffffdf0->super_MatchResultListener
                    );
  if (!bVar1) {
    in_stack_fffffffffffffdf0 =
         (StringMatchResultListener *)std::operator<<(in_RDX,"  Expected arg #");
    this = (StringMatchResultListener *)std::ostream::operator<<(in_stack_fffffffffffffdf0,0);
    std::operator<<((ostream *)this,": ");
    std::get<0ul,testing::Matcher<TestExprBuilder<0,BasicTestExpr<0>>>>
              ((tuple<testing::Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>_> *)0x2c265e);
    MatcherBase<TestExprBuilder<0,_BasicTestExpr<0>_>_>::DescribeTo
              ((MatcherBase<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)in_stack_fffffffffffffdf0,
               (ostream *)this);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<TestExprBuilder<0,BasicTestExpr<0>>>
              ((TestExprBuilder<0,_BasicTestExpr<0>_> *)in_stack_fffffffffffffdf0,(ostream *)this);
    StringMatchResultListener::str_abi_cxx11_(this);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::__cxx11::string::~string(local_200);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdf0);
  Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_>::~Matcher
            ((Matcher<TestExprBuilder<0,_BasicTestExpr<0>_>_> *)0x2c2735);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }